

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCountUtf8BytesFromStr(ImWchar *in_text,ImWchar *in_text_end)

{
  int iVar1;
  ushort *in_RSI;
  ushort *in_RDI;
  bool bVar2;
  uint c;
  int bytes_count;
  int local_14;
  ushort *local_8;
  
  local_14 = 0;
  local_8 = in_RDI;
  while( true ) {
    if ((in_RSI == (ushort *)0x0) || (bVar2 = false, local_8 < in_RSI)) {
      bVar2 = *local_8 != 0;
    }
    if (!bVar2) break;
    if (*local_8 < 0x80) {
      local_14 = local_14 + 1;
      local_8 = local_8 + 1;
    }
    else {
      iVar1 = ImTextCountUtf8BytesFromChar((uint)*local_8);
      local_14 = iVar1 + local_14;
      local_8 = local_8 + 1;
    }
  }
  return local_14;
}

Assistant:

int ImTextCountUtf8BytesFromStr(const ImWchar* in_text, const ImWchar* in_text_end)
{
    int bytes_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            bytes_count++;
        else
            bytes_count += ImTextCountUtf8BytesFromChar(c);
    }
    return bytes_count;
}